

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_img_decompress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  int *in_RDX;
  long in_RDI;
  int *unaff_retaddr;
  fitsfile *in_stack_00000008;
  double dnulval;
  float fnulval;
  float *nulladdr;
  long imgsize;
  long inc [6];
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  int anynul;
  int nullcheck;
  int datatype;
  int ii;
  int in_stack_0000023c;
  long *in_stack_00000240;
  LONGLONG *in_stack_00000248;
  LONGLONG *in_stack_00000250;
  int in_stack_0000025c;
  fitsfile *in_stack_00000260;
  void *in_stack_00000280;
  int *in_stack_00000288;
  fitsfile *in_stack_00000290;
  int *in_stack_00000298;
  int *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  undefined4 local_dc;
  undefined4 *local_d8;
  long local_d0;
  undefined8 local_c8 [6];
  undefined8 local_98 [6];
  undefined8 local_68 [2];
  int *in_stack_ffffffffffffffa8;
  fitsfile *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  int local_2c;
  int local_c;
  
  iVar1 = fits_img_decompress_header
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 < 1) {
    ffrdef(in_stack_00000008,unaff_retaddr);
    ffpscl(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
           in_stack_ffffffffffffff00);
    ffpscl(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
           in_stack_ffffffffffffff00);
    local_d8 = &local_dc;
    if (((*(int *)(*(long *)(in_RDI + 8) + 0x48c) != 8) &&
        (*(int *)(*(long *)(in_RDI + 8) + 0x48c) != 0x10)) &&
       (*(int *)(*(long *)(in_RDI + 8) + 0x48c) != 0x20)) {
      if (*(int *)(*(long *)(in_RDI + 8) + 0x48c) == -0x20) {
        local_dc = 0x8541f136;
        local_d8 = &local_dc;
      }
      else if (*(int *)(*(long *)(in_RDI + 8) + 0x48c) == -0x40) {
        local_d8 = (undefined4 *)&stack0xffffffffffffff18;
      }
    }
    local_d0 = 1;
    for (local_2c = 0; local_2c < *(int *)(*(long *)(in_RDI + 8) + 0x490); local_2c = local_2c + 1)
    {
      local_d0 = *(long *)(*(long *)(in_RDI + 8) + 0x498 + (long)local_2c * 8) * local_d0;
      local_68[local_2c] = 1;
      local_98[local_2c] = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x498 + (long)local_2c * 8);
      local_c8[local_2c] = 1;
    }
    fits_read_write_compressed_img
              (in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_00000248,
               in_stack_00000240,in_stack_0000023c,in_stack_00000280,in_stack_00000288,
               in_stack_00000290,in_stack_00000298);
    local_c = *in_RDX;
  }
  else {
    local_c = *in_RDX;
  }
  return local_c;
}

Assistant:

int fits_img_decompress (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine decompresses the whole image and writes it to the output file.
*/

{
    int ii, datatype = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (fits_img_decompress_header(infptr, outfptr, status) > 0)
    {
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }

    /* uncompress the input image and write to output image, one tile at a time */

    fits_read_write_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, &anynul, outfptr, status);

    return (*status);
}